

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O1

pid_t __thiscall ExternalCodeEditor::reap_editor(ExternalCodeEditor *this)

{
  int iVar1;
  bool bVar2;
  uint in_EAX;
  __pid_t _Var3;
  int status;
  undefined8 uStack_18;
  
  if (this->pid_ == -1) {
    _Var3 = -2;
  }
  else {
    uStack_18 = (ulong)in_EAX;
    _Var3 = waitpid(this->pid_,(int *)((long)&uStack_18 + 4),1);
    if (1 < _Var3 + 1U) {
      remove_tmpfile(this);
      this->pid_ = -1;
      iVar1 = L_editors_open + -1;
      bVar2 = L_editors_open < 2;
      L_editors_open = iVar1;
      if (bVar2) {
        stop_update_timer();
      }
      if (G_debug != 0) {
        printf("*** EDITOR REAPED: pid=%ld #open=%d\n",(long)_Var3,(ulong)(uint)L_editors_open);
      }
    }
  }
  return _Var3;
}

Assistant:

pid_t ExternalCodeEditor::reap_editor() {
  if ( !is_editing() ) return -2;
  int status = 0;
  pid_t wpid;
  switch (wpid = waitpid(pid_, &status, WNOHANG)) {
    case -1:    // waitpid() failed
      return -1;
    case 0:     // process didn't reap, still running
      return 0;
    default:    // process reaped
      remove_tmpfile(); // also zeroes mtime/size
      pid_ = -1;
      if ( --L_editors_open <= 0 )
        { stop_update_timer(); }
      break;
  }
  if ( G_debug ) 
    printf("*** EDITOR REAPED: pid=%ld #open=%d\n", long(wpid), L_editors_open);
  return wpid;
}